

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::NumberFormatterImpl::NumberFormatterImpl
          (NumberFormatterImpl *this,MacroProps *macros,bool safe,UErrorCode *status)

{
  MicroPropsGenerator *pMVar1;
  
  this->fMicroPropsGenerator = (MicroPropsGenerator *)0x0;
  MicroProps::MicroProps(&this->fMicros);
  (this->fLongNameHandler).super_LocalPointerBase<const_icu_63::number::impl::LongNameHandler>.ptr =
       (LongNameHandler *)0x0;
  (this->fCompactHandler).super_LocalPointerBase<const_icu_63::number::impl::CompactHandler>.ptr =
       (CompactHandler *)0x0;
  (this->fPatternModifier).super_LocalPointerBase<icu_63::number::impl::MutablePatternModifier>.ptr
       = (MutablePatternModifier *)0x0;
  (this->fImmutablePatternModifier).
  super_LocalPointerBase<const_icu_63::number::impl::ImmutablePatternModifier>.ptr =
       (ImmutablePatternModifier *)0x0;
  (this->fPatternInfo).super_LocalPointerBase<const_icu_63::number::impl::ParsedPatternInfo>.ptr =
       (ParsedPatternInfo *)0x0;
  (this->fScientificHandler).super_LocalPointerBase<const_icu_63::number::impl::ScientificHandler>.
  ptr = (ScientificHandler *)0x0;
  (this->fSymbols).super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr =
       (DecimalFormatSymbols *)0x0;
  (this->fRules).super_LocalPointerBase<const_icu_63::PluralRules>.ptr = (PluralRules *)0x0;
  CurrencySymbols::CurrencySymbols(&(this->fWarehouse).fCurrencySymbols);
  pMVar1 = macrosToMicroGenerator(this,macros,safe,status);
  this->fMicroPropsGenerator = pMVar1;
  return;
}

Assistant:

NumberFormatterImpl::NumberFormatterImpl(const MacroProps& macros, bool safe, UErrorCode& status) {
    fMicroPropsGenerator = macrosToMicroGenerator(macros, safe, status);
}